

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edgeHeap.cpp
# Opt level: O0

Edge * __thiscall EdgeHeap::getMinCost(EdgeHeap *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  size_type sVar8;
  const_reference pvVar9;
  priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp> *in_RSI;
  Edge *in_RDI;
  Edge *e;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Edge *this_00;
  
  this_00 = in_RDI;
  sVar8 = std::priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::size
                    ((priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>
                      *)0x31ff2a);
  if (sVar8 == 0) {
    Edge::Edge(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  else {
    while (pvVar9 = std::
                    priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::
                    top((priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>
                         *)0x31ff4f),
          (*(byte *)((long)&in_RSI[2].c.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + (long)pvVar9->id) & 1) != 0)
    {
      std::priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::pop
                (in_RSI);
    }
    pvVar9 = std::priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::top
                       ((priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>
                         *)0x31ff7c);
    iVar4 = pvVar9->id;
    iVar5 = pvVar9->v1;
    iVar6 = pvVar9->v2;
    uVar7 = *(undefined4 *)&pvVar9->field_0xc;
    dVar1 = (pvVar9->v).x;
    dVar2 = (pvVar9->v).y;
    dVar3 = pvVar9->costV;
    (this_00->v).z = (pvVar9->v).z;
    this_00->costV = dVar3;
    (this_00->v).x = dVar1;
    (this_00->v).y = dVar2;
    this_00->id = iVar4;
    this_00->v1 = iVar5;
    this_00->v2 = iVar6;
    *(undefined4 *)&this_00->field_0xc = uVar7;
    std::priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::pop(in_RSI);
  }
  return in_RDI;
}

Assistant:

Edge EdgeHeap::getMinCost(){
	if(pq.size() <= 0){
		return Edge(0,0);
	}
	while(isDeleted[pq.top().id]){
		pq.pop();
	}
	Edge e = pq.top();
	pq.pop();
	return e;
}